

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pVVar4;
  pointer pVVar5;
  Variable<tcu::Vector<float,_2>_> *pVVar6;
  pointer pcVar7;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar8;
  Variable<tcu::Vector<float,_4>_> *pVVar9;
  undefined8 uVar10;
  undefined7 uVar11;
  PrecisionCase *pPVar12;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar13;
  ulong uVar14;
  ulong uVar15;
  FloatFormat *fmt;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ContextType type;
  int iVar19;
  uint uVar20;
  _Rb_tree_node_base *p_Var21;
  char *__s;
  size_t sVar22;
  long *plVar23;
  ShaderExecutor *pSVar24;
  long lVar25;
  IVal *pIVar26;
  IVal *pIVar27;
  IVal *pIVar28;
  TestError *this_00;
  TestLog *pTVar29;
  Vector<float,_2> *val;
  undefined8 *puVar30;
  IVal *pIVar31;
  string *psVar32;
  byte bVar33;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_548;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
  *local_540;
  ulong local_538;
  undefined1 local_530 [8];
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  undefined1 local_510 [16];
  undefined1 local_500 [48];
  string local_4d0;
  double local_4b0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4a8;
  ResultCollector *local_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  double local_478;
  Data DStack_470;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  ulong local_2f0;
  FloatFormat *local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
  local_2b0;
  undefined1 local_280 [12];
  YesNoMaybe YStack_274;
  _Base_ptr p_Stack_270;
  _Rb_tree_node_base *local_268;
  _Base_ptr local_260;
  double dStack_258;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [24];
  undefined8 local_190 [11];
  ios_base local_138 [264];
  
  bVar33 = 0;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_500._32_8_ = (long)pVVar5 - (long)pVVar4 >> 3;
  local_540 = variables;
  local_500._40_8_ = stmt;
  local_4a8 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_2b0,local_500._32_8_);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e0._M_impl.super__Rb_tree_header._M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_498 + 8);
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*(*(_func_int ***)local_500._40_8_)[2])(local_500._40_8_,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_548 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_280 + 8);
  stack0xfffffffffffffd88 = (double)((ulong)YStack_274 << 0x20);
  p_Stack_270 = (_Base_ptr)0x0;
  dStack_258 = 0.0;
  local_268 = p_Var3;
  local_260 = p_Var3;
  (*(*(_func_int ***)local_500._40_8_)[4])(local_500._40_8_,local_280);
  if (local_268 != p_Var3) {
    p_Var21 = local_268;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_1a8);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var3);
  }
  pPVar12 = local_548;
  if (dStack_258 != 0.0) {
    local_498._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_510._0_8_,local_510._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
      operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"precision ",10);
  __s = glu::getPrecisionName((pPVar12->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_548 + (long)((TestLog *)(local_498._0_8_ + -0x18))->m_log) +
                    0xb0);
  }
  else {
    sVar22 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar7 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_548->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_548->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_548->m_extension);
    plVar23 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar29 = (TestLog *)(plVar23 + 2);
    if ((TestLog *)*plVar23 == pTVar29) {
      local_488._0_8_ = pTVar29->m_log;
      local_488._8_8_ = plVar23[3];
      local_498._0_8_ = (TestLog *)local_488;
    }
    else {
      local_488._0_8_ = pTVar29->m_log;
      local_498._0_8_ = (TestLog *)*plVar23;
    }
    local_498._8_8_ = plVar23[1];
    *plVar23 = (long)pTVar29;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_498);
    if ((TestLog *)local_498._0_8_ != (TestLog *)local_488) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar7) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_498,local_548,
             (local_540->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((TestLog *)local_498._0_8_ != (TestLog *)local_488) {
    operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_548,
             (local_540->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((TestLog *)local_498._0_8_ != (TestLog *)local_488) {
    operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
  }
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_498,local_548,
             (local_540->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((TestLog *)local_498._0_8_ != (TestLog *)local_488) {
    operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  (*(*(_func_int ***)local_500._40_8_)[2])(local_500._40_8_,local_498);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar12 = local_548;
  pSVar24 = ShaderExecUtil::createExecutor
                      ((local_548->m_ctx).renderContext,(local_548->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_498._0_8_ =
       (local_4a8->in0).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_498._8_8_ =
       (local_4a8->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._0_8_ =
       (local_4a8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (local_4a8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2b0.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2b0.out1.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar24->_vptr_ShaderExecutor[3])
            (pSVar24,((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar19 = (*pSVar24->_vptr_ShaderExecutor[2])(pSVar24);
  if ((char)iVar19 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar24->_vptr_ShaderExecutor[5])(pSVar24);
  (*pSVar24->_vptr_ShaderExecutor[6])(pSVar24,local_500._32_8_,local_498,local_1a8);
  (*pSVar24->_vptr_ShaderExecutor[1])(pSVar24);
  local_280[0] = false;
  stack0xfffffffffffffd88 = INFINITY;
  p_Stack_270 = (_Base_ptr)0xfff0000000000000;
  local_268 = (_Rb_tree_node_base *)((ulong)local_268 & 0xffffffffffffff00);
  local_260 = (_Base_ptr)0x7ff0000000000000;
  dStack_258 = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_498);
  pVVar13 = local_540;
  local_2e8 = &(pPVar12->m_ctx).floatFormat;
  lVar25 = 8;
  do {
    local_1a8[lVar25 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar25) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar25 + 8) = 0xfff0000000000000;
    lVar25 = lVar25 + 0x18;
  } while (lVar25 != 0x68);
  lVar25 = 8;
  do {
    local_1a8[lVar25 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar25) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar25 + 8) = 0xfff0000000000000;
    lVar25 = lVar25 + 0x18;
  } while (lVar25 != 0x68);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2e0,
             (local_540->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_280);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar13->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_510);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar13->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_530);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar13->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4d0);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_2e0,
             (pVVar13->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_498);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2e0,
             (pVVar13->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  if (pVVar5 == pVVar4) {
LAB_0076e04d:
    local_498._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a0 = &local_548->m_status;
    local_2f0 = local_500._32_8_ + (ulong)((double)local_500._32_8_ == 0.0);
    local_538 = 0;
    local_4b0 = 0.0;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      lVar25 = 8;
      do {
        local_280[lVar25 + -8] = 0;
        *(undefined8 *)(local_280 + lVar25) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar25 + 8) = 0xfff0000000000000;
        lVar25 = lVar25 + 0x18;
      } while (lVar25 != 0x68);
      lVar25 = 8;
      do {
        local_280[lVar25 + -8] = 0;
        *(undefined8 *)(local_280 + lVar25) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar25 + 8) = 0xfff0000000000000;
        lVar25 = lVar25 + 0x18;
      } while (lVar25 != 0x68);
      if ((local_538 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_548->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_2e8;
      pVVar4 = (local_4a8->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_530._0_4_ = pVVar4[local_538].m_data[0];
      local_530._4_4_ = pVVar4[local_538].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_510,local_2e8,(Vector<float,_2> *)local_530);
      pVVar13 = local_540;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_498,fmt,(IVal *)local_510);
      pIVar26 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2e0,
                           (pVVar13->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar26->m_data[1].m_lo = local_478;
      pIVar26->m_data[1].m_hi = (double)CONCAT44(DStack_470.basic.precision,DStack_470.basic.type);
      pIVar26->m_data[0].m_hi = (double)local_488._0_8_;
      *(undefined8 *)(pIVar26->m_data + 1) = local_488._8_8_;
      *(undefined8 *)pIVar26->m_data = local_498._0_8_;
      pIVar26->m_data[0].m_lo = (double)local_498._8_8_;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar13->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar13->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar13->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_470.basic.type = (local_548->m_ctx).precision;
      local_478 = fmt->m_maxValue;
      local_498._0_8_ = *(undefined8 *)fmt;
      local_498._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_488._0_8_ = *(undefined8 *)&fmt->m_hasInf;
      local_488._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_460 = 0;
      DStack_470._8_8_ = &local_2e0;
      (*(*(_func_int ***)local_500._40_8_)[3])(local_500._40_8_,(IVal *)local_498);
      pIVar27 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2e0,
                           (pVVar13->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar27);
      uVar14 = local_538;
      pIVar27 = (IVal *)local_498;
      pIVar31 = (IVal *)local_280;
      for (lVar25 = 0xc; lVar25 != 0; lVar25 = lVar25 + -1) {
        uVar11 = *(undefined7 *)&pIVar27->m_data[0].field_0x1;
        pIVar31->m_data[0].m_hasNaN = pIVar27->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar31->m_data[0].field_0x1 = uVar11;
        pIVar27 = (IVal *)((long)pIVar27 + ((ulong)bVar33 * -2 + 1) * 8);
        pIVar31 = (IVal *)((long)pIVar31 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_280,
                          local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_538);
      local_498._0_8_ = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(local_4a0,bVar16,(string *)local_498);
      if ((TestLog *)local_498._0_8_ != (TestLog *)local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
      }
      pIVar28 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_2e0,
                           (local_540->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar28);
      uVar15 = local_538;
      puVar30 = (undefined8 *)local_1a8;
      psVar32 = (string *)local_498;
      bVar18 = true;
      do {
        bVar17 = bVar18;
        lVar25 = 0;
        do {
          *(undefined8 *)((long)puVar30 + lVar25 + 0x10) =
               *(undefined8 *)((long)&psVar32->field_2 + lVar25);
          puVar1 = (undefined8 *)((long)&(psVar32->_M_dataplus)._M_p + lVar25);
          uVar10 = puVar1[1];
          *(undefined8 *)((long)puVar30 + lVar25) = *puVar1;
          ((undefined8 *)((long)puVar30 + lVar25))[1] = uVar10;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0xc0);
        puVar30 = local_190;
        psVar32 = (string *)(local_488 + 8);
        bVar18 = false;
      } while (bVar17);
      bVar18 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_538);
      local_498._0_8_ = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(local_4a0,bVar18,(string *)local_498);
      if ((pointer)local_498._0_8_ != (pointer)local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
      }
      if (!bVar16 || !bVar18) {
        uVar20 = SUB84(local_4b0,0) + 1;
        local_4b0 = (double)(ulong)uVar20;
        poVar2 = (ostringstream *)(local_498 + 8);
        if ((int)uVar20 < 0x65) {
          local_498._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar6 = (local_540->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          val = (Vector<float,_2> *)local_500;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_510._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((local_4a8->in0).
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_538),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)CONCAT44(local_530._4_4_,local_530._0_4_),local_528);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_530._4_4_,local_530._0_4_) != &local_520) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_530._4_4_,local_530._0_4_),
                            local_520._M_allocated_capacity + 1);
          }
          if ((Vector<float,_2> *)local_510._0_8_ != (Vector<float,_2> *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar8 = (local_540->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pIVar28 = (IVal *)local_500;
          pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
          local_510._0_8_ = pIVar28;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2b0.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15),
                     (Matrix<float,_2,_4> *)pIVar28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)CONCAT44(local_530._4_4_,local_530._0_4_),local_528);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_4d0,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_1a8,pIVar28
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_530._4_4_,local_530._0_4_) != &local_520) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_530._4_4_,local_530._0_4_),
                            local_520._M_allocated_capacity + 1);
          }
          if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar9 = (local_540->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pIVar27 = (IVal *)local_500;
          pcVar7 = (pVVar9->m_name)._M_dataplus._M_p;
          local_510._0_8_ = pIVar27;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar7,pcVar7 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)local_530,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2b0.out1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar14),
                     (Vector<float,_4> *)pIVar27);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)CONCAT44(local_530._4_4_,local_530._0_4_),local_528);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    (&local_4d0,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_280,pIVar27
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_530._4_4_,local_530._0_4_) != &local_520) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_530._4_4_,local_530._0_4_),
                            local_520._M_allocated_capacity + 1);
          }
          if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_420);
        }
      }
      local_538 = local_538 + 1;
    } while (local_538 != local_2f0);
    iVar19 = SUB84(local_4b0,0);
    if (iVar19 < 0x65) {
      if (iVar19 == 0) goto LAB_0076e04d;
    }
    else {
      local_498._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_498 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,iVar19 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_420);
    }
    local_498._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
  std::ios_base::~ios_base(local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_2b0.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}